

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O0

size_type __thiscall baryonyx::itm::shared_subvector::emplace(shared_subvector *this)

{
  size_type *psVar1;
  size_type sVar2;
  value_type_conflict local_29;
  __normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_> local_28
  ;
  const_iterator local_20;
  uint local_14;
  shared_subvector *psStack_10;
  size_type new_position;
  shared_subvector *this_local;
  
  local_14 = 0;
  psStack_10 = this;
  if (this->m_free_list_head == 0xffffffff) {
    sVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::size(&this->m_container);
    local_14 = (uint)sVar2;
    local_28._M_current =
         (char *)std::end<std::vector<signed_char,std::allocator<signed_char>>>(&this->m_container);
    __gnu_cxx::
    __normal_iterator<signed_char_const*,std::vector<signed_char,std::allocator<signed_char>>>::
    __normal_iterator<signed_char*>
              ((__normal_iterator<signed_char_const*,std::vector<signed_char,std::allocator<signed_char>>>
                *)&local_20,&local_28);
    local_29 = '\0';
    std::vector<signed_char,_std::allocator<signed_char>_>::insert
              (&this->m_container,local_20,(ulong)this->m_element_size,&local_29);
  }
  else {
    local_14 = this->m_free_list_head;
    psVar1 = (size_type *)
             std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       (&this->m_container,(ulong)local_14);
    this->m_free_list_head = *psVar1;
  }
  check_index(this,local_14);
  return local_14;
}

Assistant:

[[nodiscard]] size_type emplace()
    {
        size_type new_position = 0;

        if (m_free_list_head != npos) {
            new_position = m_free_list_head;

            m_free_list_head =
              *(reinterpret_cast<size_type*>(&m_container[new_position]));

        } else {
            new_position = static_cast<size_type>(m_container.size());
            m_container.insert(std::end(m_container), m_element_size, 0);
        }

        check_index(new_position);

        return new_position;
    }